

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_math_impl.h
# Opt level: O0

bool check_div_int64_uint64(int64_t a,uint64_t b,int64_t *ret)

{
  uint64_t uVar1;
  ulong uVar2;
  ulong *in_RDX;
  ulong in_RSI;
  ulong in_RDI;
  uint64_t tmp;
  undefined1 local_1;
  
  if (in_RSI == 0) {
    local_1 = false;
  }
  else {
    if ((long)in_RDI < 0) {
      uVar1 = safe_abs64(in_RDI);
      uVar2 = negate64(uVar1 / in_RSI);
      *in_RDX = uVar2;
    }
    else {
      *in_RDX = in_RDI / in_RSI;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

static inline bool check_div_int64_uint64(int64_t a, uint64_t b, int64_t* ret)
{
    if (b == 0)
        return false;

    if(a >= 0)
    {
        *ret = (int64_t)((uint64_t)a / b);
    }
    else
    {
        // Need to get the magnitude, divide, and then negate
        uint64_t tmp = safe_abs64(a);
        tmp /= b;
        *ret = negate64((int64_t)tmp);
    }
        return true;
}